

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_graph_utilities.cpp
# Opt level: O0

void __thiscall
test_graph_utilities_pseudo_peripheral_vertex_Test::TestBody
          (test_graph_utilities_pseudo_peripheral_vertex_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  char *regex_00;
  AssertHelper local_200;
  Message local_1f8 [6];
  exception *gtest_exception_1;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_1a0;
  DeathTest *gtest_dt_1;
  Message local_190;
  int local_184;
  exception *gtest_exception;
  pointer puStack_150;
  pointer local_148;
  pointer puStack_140;
  pointer local_138;
  pointer puStack_130;
  ReturnSentinel local_120;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_f8;
  DeathTest *gtest_dt;
  Message local_e8;
  int local_dc;
  size_t local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  pair<unsigned_long,_unsigned_long> local_b8;
  AssertHelper local_a8;
  Message local_a0;
  int local_94;
  size_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  int local_68 [4];
  size_t local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  Adjacency_Graph<false> graph_saad;
  test_graph_utilities_pseudo_peripheral_vertex_Test *this_local;
  
  Disa::create_graph_saad();
  local_58 = Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                       ((Adjacency_Graph<false> *)&gtest_ar.message_,0xb);
  local_68[0] = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_50,"pseudo_peripheral_vertex(graph_saad, 11)","5",&local_58,local_68)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x76,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_90 = Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                       ((Adjacency_Graph<false> *)&gtest_ar.message_,2);
  local_94 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_88,"pseudo_peripheral_vertex(graph_saad, 2)","0",&local_90,&local_94)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x77,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xf;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_b8,
             (int *)((long)&gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),(int *)&gtest_ar_2.message_);
  Disa::Adjacency_Graph<false>::insert((Adjacency_Graph<false> *)&gtest_ar.message_,&local_b8);
  local_d8 = Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                       ((Adjacency_Graph<false> *)&gtest_ar.message_,5);
  local_dc = 0xf;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d0,"pseudo_peripheral_vertex(graph_saad, 5)","15",&local_d8,&local_dc
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("pseudo_peripheral_vertex(Adjacency_Graph<false>())",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
                       ,0x7e,&local_f8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00112767;
    if (local_f8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_f8);
      iVar2 = (*local_f8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_f8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_f8->_vptr_DeathTest[4])(local_f8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00112729;
        local_184 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_120,local_f8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_138 = (pointer)0x0;
            puStack_130 = (pointer)0x0;
            local_148 = (pointer)0x0;
            puStack_140 = (pointer)0x0;
            gtest_exception = (exception *)0x0;
            puStack_150 = (pointer)0x0;
            Disa::Adjacency_Graph<false>::Adjacency_Graph
                      ((Adjacency_Graph<false> *)&gtest_exception);
            Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                      ((Adjacency_Graph<false> *)&gtest_exception,0);
            Disa::Adjacency_Graph<false>::~Adjacency_Graph
                      ((Adjacency_Graph<false> *)&gtest_exception);
          }
          (*local_f8->_vptr_DeathTest[5])(local_f8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_120);
        }
LAB_00112729:
        local_184 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_184 != 0) goto LAB_00112767;
    }
  }
  else {
LAB_00112767:
    testing::Message::Message(&local_190);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_190);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("pseudo_peripheral_vertex(graph_saad, 16)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
                       ,0x7f,&local_1a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_1a0 == (pointer)0x0) goto LAB_00112c3e;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_1a0);
      iVar2 = (*local_1a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1a0->_vptr_DeathTest[4])(local_1a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00112b5b;
        local_184 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1,local_1a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                      ((Adjacency_Graph<false> *)&gtest_ar.message_,0x10);
          }
          (*local_1a0->_vptr_DeathTest[5])(local_1a0,2);
          local_184 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1);
        }
LAB_00112b5b:
        local_184 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_184 == 0) goto LAB_00112c3e;
    }
  }
  testing::Message::Message(local_1f8);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_200,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
             ,0x7f,pcVar4);
  testing::internal::AssertHelper::operator=(&local_200,local_1f8);
  testing::internal::AssertHelper::~AssertHelper(&local_200);
  testing::Message::~Message(local_1f8);
LAB_00112c3e:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(test_graph_utilities, pseudo_peripheral_vertex) {

  Adjacency_Graph graph_saad = create_graph_saad();

  // Check to get the end vertices.
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 11), 5);
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 2), 0);

  // Insert a new edge, then search from the otheside of the graph, this should be the new peripheral vertex.
  graph_saad.insert({0, 15});
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 5), 15);

  // Death test.
  EXPECT_DEATH(pseudo_peripheral_vertex(Adjacency_Graph<false>()), "./*");
  EXPECT_DEATH(pseudo_peripheral_vertex(graph_saad, 16), "./*");
}